

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_group.c
# Opt level: O0

char * unshield_file_group_name(Unshield *unshield,int index)

{
  Header *header;
  int index_local;
  Unshield *unshield_local;
  
  if ((index < 0) || (unshield->header_list->file_group_count <= index)) {
    unshield_local = (Unshield *)0x0;
  }
  else {
    unshield_local = (Unshield *)unshield->header_list->file_groups[index]->name;
  }
  return (char *)unshield_local;
}

Assistant:

const char* unshield_file_group_name(Unshield* unshield, int index)/*{{{*/
{
  Header* header = unshield->header_list;

  if (index >= 0 && index < header->file_group_count)
    return header->file_groups[index]->name;
  else
    return NULL;
}